

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
ft::vector<int,_ft::allocator<int>_>::insert
          (vector<int,_ft::allocator<int>_> *this,iterator position,size_type n,
          value_type_conflict *val)

{
  iterator piVar1;
  value_type_conflict *local_70;
  iterator it;
  size_type i;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_ft::allocator<int>_> tmp;
  value_type_conflict *val_local;
  size_type n_local;
  iterator position_local;
  vector<int,_ft::allocator<int>_> *this_local;
  
  tmp._24_8_ = val;
  piVar1 = end(this);
  allocator<int>::allocator(&local_49);
  vector<int,ft::allocator<int>>::vector<int*>
            ((vector<int,ft::allocator<int>> *)local_48,position,piVar1,&local_49,(type *)0x0);
  allocator<int>::~allocator(&local_49);
  while( true ) {
    piVar1 = end(this);
    if (position == piVar1) break;
    pop_back(this);
  }
  for (it = (iterator)0x0; it < n; it = (iterator)((long)it + 1)) {
    push_back(this,(value_type_conflict *)tmp._24_8_);
  }
  local_70 = begin((vector<int,_ft::allocator<int>_> *)local_48);
  while( true ) {
    piVar1 = end((vector<int,_ft::allocator<int>_> *)local_48);
    if (local_70 == piVar1) break;
    push_back(this,local_70);
    local_70 = local_70 + 1;
  }
  ~vector((vector<int,_ft::allocator<int>_> *)local_48);
  return;
}

Assistant:

void        insert(iterator position, size_type n, value_type const & val) {
		vector	tmp(position, this->end());
		while (position != this->end())
			this->pop_back();
		for (size_type i = 0; i < n; ++i)
			this->push_back(val);
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
	}